

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::HairSetNode::HairSetNode
          (HairSetNode *this,Ref<embree::SceneGraph::HairSetNode> *imesh,Transformations *spaces)

{
  MaterialNode *pMVar1;
  
  Node::Node(&this->super_Node,true);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__HairSetNode_002a7a70;
  this->time_range = imesh->ptr->time_range;
  this->type = imesh->ptr->type;
  transformMSMBlurBuffer<embree::Vec3fx>(&this->positions,&imesh->ptr->positions,spaces);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(&this->normals,&imesh->ptr->normals,spaces);
  transformMSMBlurVectorBuffer<embree::Vec3fx>(&this->tangents,&imesh->ptr->tangents,spaces);
  transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>(&this->dnormals,&imesh->ptr->dnormals,spaces);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::vector(&this->hairs,&imesh->ptr->hairs);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->flags,&imesh->ptr->flags);
  pMVar1 = (imesh->ptr->material).ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  this->tessellation_rate = imesh->ptr->tessellation_rate;
  return;
}

Assistant:

HairSetNode (Ref<SceneGraph::HairSetNode> imesh, const Transformations& spaces)
        : Node(true),
        time_range(imesh->time_range),
        type(imesh->type),
        positions(transformMSMBlurBuffer(imesh->positions,spaces)),
        normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        tangents(transformMSMBlurVectorBuffer(imesh->tangents,spaces)),
        dnormals(transformMSMBlurVectorVec3faBuffer(imesh->dnormals,spaces)),
        hairs(imesh->hairs), flags(imesh->flags), material(imesh->material), tessellation_rate(imesh->tessellation_rate) {}